

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring bstrcpy(const_bstring b)

{
  ulong __size;
  uint uVar1;
  uchar *__src;
  uint uVar2;
  bstring __ptr;
  uchar *puVar3;
  size_t __size_00;
  uint uVar4;
  ulong __n;
  
  if (b != (const_bstring)0x0) {
    uVar1 = b->slen;
    __n = (ulong)uVar1;
    if (((-1 < (int)uVar1) && (__src = b->data, __src != (uchar *)0x0)) &&
       (__ptr = (bstring)malloc(0x10), __ptr != (bstring)0x0)) {
      __size = __n + 1;
      __size_00 = 8;
      uVar4 = (uint)__size;
      if ((6 < (int)uVar1) &&
         (uVar2 = (uint)(__size >> 1) & 0x7fffffff | uVar4, uVar2 = uVar2 >> 2 | uVar2,
         uVar2 = uVar2 >> 4 | uVar2, uVar2 = uVar2 >> 8 | uVar2, uVar2 = (uVar2 >> 0x10 | uVar2) + 1
         , __size_00 = (size_t)uVar2, (int)uVar2 <= (int)uVar4)) {
        __size_00 = __size & 0xffffffff;
      }
      puVar3 = (uchar *)malloc(__size_00);
      __ptr->data = puVar3;
      uVar2 = (uint)__size_00;
      if (puVar3 == (uchar *)0x0) {
        puVar3 = (uchar *)malloc(__size);
        __ptr->data = puVar3;
        uVar2 = uVar4;
        if (puVar3 == (uchar *)0x0) {
          free(__ptr);
          return (bstring)0x0;
        }
      }
      __ptr->mlen = uVar2;
      __ptr->slen = uVar1;
      if (uVar1 != 0) {
        memcpy(__ptr->data,__src,__n);
      }
      __ptr->data[__n] = '\0';
      return __ptr;
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bstrcpy (const_bstring b) {
bstring b0;
int i,j;

	/* Attempted to copy an invalid string? */
	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;

	b0 = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b0 == NULL) {
		/* Unable to allocate memory for string header */
		return NULL;
	}

	i = b->slen;
	j = snapUpSize (i + 1);

	b0->data = (unsigned char *) bstr__alloc (j);
	if (b0->data == NULL) {
		j = i + 1;
		b0->data = (unsigned char *) bstr__alloc (j);
		if (b0->data == NULL) {
			/* Unable to allocate memory for string data */
			bstr__free (b0);
			return NULL;
		}
	}

	b0->mlen = j;
	b0->slen = i;

	if (i) bstr__memcpy ((char *) b0->data, (char *) b->data, i);
	b0->data[b0->slen] = (unsigned char) '\0';

	return b0;
}